

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O3

ngx_int_t ngx_hash_add_key(ngx_hash_keys_arrays_t *ha,ngx_str_t *key,void *value,ngx_uint_t flags)

{
  long lVar1;
  byte bVar2;
  u_char uVar3;
  ngx_pool_t *pnVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  void *pvVar9;
  size_t *psVar10;
  ngx_array_t *pnVar11;
  long lVar12;
  size_t *psVar13;
  size_t sVar14;
  size_t sVar15;
  u_char *puVar16;
  undefined8 *puVar17;
  size_t sVar18;
  byte bVar19;
  ngx_int_t nVar20;
  size_t size;
  ngx_uint_t nVar21;
  long local_50;
  u_char *local_38;
  
  size = key->len;
  if ((flags & 1) == 0) {
    if (size == 0) {
LAB_00115629:
      bVar5 = true;
      uVar8 = 0;
    }
    else {
LAB_0011556b:
      puVar16 = key->data;
      uVar8 = 0;
      sVar18 = 0;
      do {
        if ((flags & 2) == 0) {
          bVar2 = puVar16[sVar18];
          bVar19 = bVar2 | 0x20;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            bVar19 = bVar2;
          }
          puVar16[sVar18] = bVar19;
          puVar16 = key->data;
        }
        uVar8 = (ulong)puVar16[sVar18] + uVar8 * 0x1f;
        sVar18 = sVar18 + 1;
      } while (size != sVar18);
      bVar5 = false;
    }
    uVar8 = uVar8 % ha->hsize;
    pnVar11 = ha->keys_hash;
    if (pnVar11[uVar8].elts == (void *)0x0) {
      pnVar11 = pnVar11 + uVar8;
      pnVar4 = ha->temp_pool;
      pnVar11->nelts = 0;
      pnVar11->size = 0x10;
      pnVar11->nalloc = 4;
      pnVar11->pool = pnVar4;
      pvVar9 = ngx_palloc(pnVar4,0x40);
      pnVar11->elts = pvVar9;
      if (pvVar9 == (void *)0x0) goto LAB_00115b2d;
      pnVar11 = ha->keys_hash;
    }
    else {
      nVar21 = pnVar11[uVar8].nelts;
      if (nVar21 != 0) {
        puVar17 = (undefined8 *)((long)pnVar11[uVar8].elts + 8);
        do {
          if ((size == puVar17[-1]) &&
             (iVar7 = strncmp((char *)key->data,(char *)*puVar17,size), iVar7 == 0)) {
            return -3;
          }
          puVar17 = puVar17 + 2;
          nVar21 = nVar21 - 1;
        } while (nVar21 != 0);
      }
    }
    psVar10 = (size_t *)ngx_array_push(pnVar11 + uVar8);
    if (psVar10 == (size_t *)0x0) {
      return -1;
    }
    puVar16 = key->data;
    *psVar10 = key->len;
    psVar10[1] = (size_t)puVar16;
    psVar10 = (size_t *)ngx_array_push(&ha->keys);
    if (psVar10 == (size_t *)0x0) {
      return -1;
    }
    puVar16 = key->data;
    *psVar10 = key->len;
    psVar10[1] = (size_t)puVar16;
    if (bVar5) {
LAB_00115719:
      sVar14 = 0;
    }
    else {
      sVar14 = 0;
      sVar18 = 0;
      do {
        sVar14 = (ulong)key->data[sVar18] + sVar14 * 0x1f;
        sVar18 = sVar18 + 1;
      } while (size != sVar18);
    }
    psVar10[2] = sVar14;
    psVar10[3] = (size_t)value;
    nVar20 = 0;
  }
  else {
    if (size == 0) goto LAB_00115629;
    bVar5 = false;
    sVar18 = 0;
    do {
      uVar3 = key->data[sVar18];
      if (uVar3 == '*') {
        bVar6 = true;
        if (bVar5) {
          return -5;
        }
      }
      else {
        bVar6 = bVar5;
        if (uVar3 == '.') {
          if (key->data[sVar18 + 1] == '.') {
            return -5;
          }
        }
        else if (uVar3 == '\0') {
          return -5;
        }
      }
      bVar5 = bVar6;
      sVar18 = sVar18 + 1;
    } while (size != sVar18);
    if (size == 1) {
LAB_0011561b:
      if (bVar5) {
        return -5;
      }
      goto LAB_0011556b;
    }
    puVar16 = key->data;
    uVar3 = *puVar16;
    if (uVar3 == '.') {
      sVar14 = 1;
LAB_00115761:
      bVar5 = false;
    }
    else {
      if (size == 2) goto LAB_0011561b;
      if ((uVar3 == '*') && (puVar16[1] == '.')) {
        sVar14 = 2;
        goto LAB_00115761;
      }
      if ((puVar16[size - 2] != '.') || (puVar16[size - 1] != '*')) goto LAB_0011561b;
      size = size - 2;
      bVar5 = true;
      sVar14 = 0;
    }
    sVar18 = size - sVar14;
    if (sVar18 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      sVar15 = sVar14;
      do {
        bVar2 = puVar16[sVar15];
        bVar19 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar19 = bVar2;
        }
        puVar16[sVar15] = bVar19;
        uVar8 = (ulong)bVar19 + uVar8 * 0x1f;
        sVar15 = sVar15 + 1;
      } while (size != sVar15);
    }
    uVar8 = uVar8 % ha->hsize;
    if (uVar3 == '.') {
      pnVar11 = ha->keys_hash;
      if (pnVar11[uVar8].elts == (void *)0x0) {
        pnVar11 = pnVar11 + uVar8;
        pnVar4 = ha->temp_pool;
        pnVar11->nelts = 0;
        pnVar11->size = 0x10;
        pnVar11->nalloc = 4;
        pnVar11->pool = pnVar4;
        pvVar9 = ngx_palloc(pnVar4,0x40);
        pnVar11->elts = pvVar9;
        if (pvVar9 == (void *)0x0) goto LAB_00115b2d;
        pnVar11 = ha->keys_hash;
      }
      else {
        nVar21 = pnVar11[uVar8].nelts;
        if (nVar21 != 0) {
          puVar17 = (undefined8 *)((long)pnVar11[uVar8].elts + 8);
          do {
            if ((sVar18 == puVar17[-1]) &&
               (iVar7 = strncmp((char *)(key->data + 1),(char *)*puVar17,sVar18), iVar7 == 0)) {
              return -3;
            }
            puVar17 = puVar17 + 2;
            nVar21 = nVar21 - 1;
          } while (nVar21 != 0);
        }
      }
      psVar10 = (size_t *)ngx_array_push(pnVar11 + uVar8);
      if (psVar10 == (size_t *)0x0) {
        return -1;
      }
      *psVar10 = size - 1;
      pvVar9 = ngx_pnalloc(ha->temp_pool,size - 1);
      psVar10[1] = (size_t)pvVar9;
      if (pvVar9 == (void *)0x0) {
        return -1;
      }
      memcpy(pvVar9,key->data + 1,*psVar10);
    }
    if (bVar5) {
      size = size + 1;
      local_38 = (u_char *)ngx_pnalloc(ha->temp_pool,size);
      if (local_38 != (u_char *)0x0) {
        ngx_cpystrn(local_38,key->data,size);
        lVar12 = 0xa0;
        local_50 = 0x78;
LAB_00115a21:
        pnVar11 = (ngx_array_t *)(*(long *)((long)&ha->hsize + lVar12) + uVar8 * 0x28);
        if (pnVar11->elts == (void *)0x0) {
          pnVar4 = ha->temp_pool;
          pnVar11->nelts = 0;
          pnVar11->size = 0x10;
          pnVar11->nalloc = 4;
          pnVar11->pool = pnVar4;
          pvVar9 = ngx_palloc(pnVar4,0x40);
          pnVar11->elts = pvVar9;
          if (pvVar9 == (void *)0x0) goto LAB_00115b2d;
        }
        else {
          nVar21 = pnVar11->nelts;
          if (nVar21 != 0) {
            puVar17 = (undefined8 *)((long)pnVar11->elts + 8);
            do {
              if ((size - sVar14 == puVar17[-1]) &&
                 (iVar7 = strncmp((char *)(key->data + sVar14),(char *)*puVar17,size - sVar14),
                 iVar7 == 0)) {
                return -3;
              }
              puVar17 = puVar17 + 2;
              nVar21 = nVar21 - 1;
            } while (nVar21 != 0);
          }
        }
        psVar13 = (size_t *)ngx_array_push(pnVar11);
        if (psVar13 == (size_t *)0x0) {
          return -1;
        }
        *psVar13 = size - sVar14;
        pvVar9 = ngx_pnalloc(ha->temp_pool,size - sVar14);
        psVar13[1] = (size_t)pvVar9;
        if (pvVar9 == (void *)0x0) {
          return -1;
        }
        memcpy(pvVar9,key->data + sVar14,*psVar13);
        psVar10 = (size_t *)ngx_array_push((ngx_array_t *)((long)&ha->hsize + local_50));
        if (psVar10 == (size_t *)0x0) {
          return -1;
        }
        *psVar10 = size - 1;
        psVar10[1] = (size_t)local_38;
        goto LAB_00115719;
      }
    }
    else {
      local_38 = (u_char *)ngx_pnalloc(ha->temp_pool,size);
      if (local_38 != (u_char *)0x0) {
        if (size == 1) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          sVar18 = 0;
          sVar15 = size;
          do {
            if (key->data[sVar15 - 1] == '.') {
              memcpy(local_38 + lVar12,key->data + sVar15,sVar18);
              lVar1 = lVar12 + sVar18;
              lVar12 = lVar12 + sVar18 + 1;
              local_38[lVar1] = '.';
              sVar18 = 0;
            }
            else {
              sVar18 = sVar18 + 1;
            }
            sVar15 = sVar15 - 1;
          } while (sVar15 != 1);
          if (sVar18 != 0) {
            memcpy(local_38 + lVar12,key->data + 1,sVar18);
            lVar12 = lVar12 + sVar18;
          }
        }
        local_38[lVar12] = '\0';
        lVar12 = 0x70;
        local_50 = 0x48;
        goto LAB_00115a21;
      }
    }
LAB_00115b2d:
    nVar20 = -1;
  }
  return nVar20;
}

Assistant:

ngx_int_t
ngx_hash_add_key(ngx_hash_keys_arrays_t *ha, ngx_str_t *key, void *value,
    ngx_uint_t flags)
{
    size_t           len;
    u_char          *p;
    ngx_str_t       *name;
    ngx_uint_t       i, k, n, skip, last;
    ngx_array_t     *keys, *hwc;
    ngx_hash_key_t  *hk;

    last = key->len;

    if (flags & NGX_HASH_WILDCARD_KEY) {

        /*
         * supported wildcards:
         *     "*.example.com", ".example.com", and "www.example.*"
         */

        n = 0;

        for (i = 0; i < key->len; i++) {

            if (key->data[i] == '*') {
                if (++n > 1) {
                    return NGX_DECLINED;
                }
            }

            if (key->data[i] == '.' && key->data[i + 1] == '.') {
                return NGX_DECLINED;
            }

            if (key->data[i] == '\0') {
                return NGX_DECLINED;
            }
        }

        if (key->len > 1 && key->data[0] == '.') {
            skip = 1;
            goto wildcard;
        }

        if (key->len > 2) {

            if (key->data[0] == '*' && key->data[1] == '.') {
                skip = 2;
                goto wildcard;
            }

            if (key->data[i - 2] == '.' && key->data[i - 1] == '*') {
                skip = 0;
                last -= 2;
                goto wildcard;
            }
        }

        if (n) {
            return NGX_DECLINED;
        }
    }

    /* exact hash */

    k = 0;

    for (i = 0; i < last; i++) {
        if (!(flags & NGX_HASH_READONLY_KEY)) {
            key->data[i] = ngx_tolower(key->data[i]);
        }
        k = ngx_hash(k, key->data[i]);
    }

    k %= ha->hsize;

    /* check conflicts in exact hash */

    name = ha->keys_hash[k].elts;

    if (name) {
        for (i = 0; i < ha->keys_hash[k].nelts; i++) {
            if (last != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data, name[i].data, last) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                           sizeof(ngx_str_t))
            != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(&ha->keys_hash[k]);
    if (name == NULL) {
        return NGX_ERROR;
    }

    *name = *key;

    hk = ngx_array_push(&ha->keys);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key = *key;
    hk->key_hash = ngx_hash_key(key->data, last);
    hk->value = value;

    return NGX_OK;


wildcard:

    /* wildcard hash */

    k = ngx_hash_strlow(&key->data[skip], &key->data[skip], last - skip);

    k %= ha->hsize;

    if (skip == 1) {

        /* check conflicts in exact hash for ".example.com" */

        name = ha->keys_hash[k].elts;

        if (name) {
            len = last - skip;

            for (i = 0; i < ha->keys_hash[k].nelts; i++) {
                if (len != name[i].len) {
                    continue;
                }

                if (ngx_strncmp(&key->data[1], name[i].data, len) == 0) {
                    return NGX_BUSY;
                }
            }

        } else {
            if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                               sizeof(ngx_str_t))
                != NGX_OK)
            {
                return NGX_ERROR;
            }
        }

        name = ngx_array_push(&ha->keys_hash[k]);
        if (name == NULL) {
            return NGX_ERROR;
        }

        name->len = last - 1;
        name->data = ngx_pnalloc(ha->temp_pool, name->len);
        if (name->data == NULL) {
            return NGX_ERROR;
        }

        ngx_memcpy(name->data, &key->data[1], name->len);
    }


    if (skip) {

        /*
         * convert "*.example.com" to "com.example.\0"
         *      and ".example.com" to "com.example\0"
         */

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        len = 0;
        n = 0;

        for (i = last - 1; i; i--) {
            if (key->data[i] == '.') {
                ngx_memcpy(&p[n], &key->data[i + 1], len);
                n += len;
                p[n++] = '.';
                len = 0;
                continue;
            }

            len++;
        }

        if (len) {
            ngx_memcpy(&p[n], &key->data[1], len);
            n += len;
        }

        p[n] = '\0';

        hwc = &ha->dns_wc_head;
        keys = &ha->dns_wc_head_hash[k];

    } else {

        /* convert "www.example.*" to "www.example\0" */

        last++;

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        ngx_cpystrn(p, key->data, last);

        hwc = &ha->dns_wc_tail;
        keys = &ha->dns_wc_tail_hash[k];
    }


    /* check conflicts in wildcard hash */

    name = keys->elts;

    if (name) {
        len = last - skip;

        for (i = 0; i < keys->nelts; i++) {
            if (len != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data + skip, name[i].data, len) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(keys, ha->temp_pool, 4, sizeof(ngx_str_t)) != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(keys);
    if (name == NULL) {
        return NGX_ERROR;
    }

    name->len = last - skip;
    name->data = ngx_pnalloc(ha->temp_pool, name->len);
    if (name->data == NULL) {
        return NGX_ERROR;
    }

    ngx_memcpy(name->data, key->data + skip, name->len);


    /* add to wildcard hash */

    hk = ngx_array_push(hwc);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key.len = last - 1;
    hk->key.data = p;
    hk->key_hash = 0;
    hk->value = value;

    return NGX_OK;
}